

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

Cnf_Dat_t * Cnf_DeriveGiaRemapped(Gia_Man_t *p)

{
  int nOutputs;
  Aig_Man_t *p_00;
  Cnf_Dat_t *pCVar1;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManToAigSimple(p);
  p_00->nRegs = 0;
  nOutputs = Aig_ManCoNum(p_00);
  pCVar1 = Cnf_Derive(p_00,nOutputs);
  Aig_ManStop(p_00);
  return pCVar1;
}

Assistant:

static inline Cnf_Dat_t * Cnf_DeriveGiaRemapped( Gia_Man_t * p )
{
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pAig = Gia_ManToAigSimple( p );
    pAig->nRegs = 0;
    pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    Aig_ManStop( pAig );
    return pCnf;
//    return (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
}